

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MultiIterNext(Fts5Index *p,Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  ushort uVar1;
  Fts5DlidxIter *pIter_00;
  ushort *puVar2;
  byte bVar3;
  int iVar4;
  ushort uVar5;
  Fts5SegIter *pIter_01;
  bool bVar6;
  int bNewTerm;
  Fts5SegIter *pSeg;
  int local_50;
  int local_4c;
  Fts5SegIter *local_48;
  uint local_3c;
  Fts5SegIter *local_38;
  
  local_38 = pIter->aSeg;
  local_50 = bFrom;
  do {
    if (p->rc != 0) {
      return;
    }
    uVar1 = pIter->aFirst[1].iFirst;
    local_4c = 0;
    pIter_01 = local_38 + uVar1;
    local_48 = pIter_01;
    if ((local_50 == 0) || (pIter_00 = pIter_01->pDlidx, pIter_00 == (Fts5DlidxIter *)0x0)) {
      (*pIter_01->xNext)(p,pIter_01,&local_4c);
    }
    else {
      local_3c = pIter_01->flags;
      if ((local_3c & 2) == 0) {
        iVar4 = pIter_01->iLeafPgno;
        do {
          if ((pIter_00->aLvl[0].bEof != 0) || (iFrom <= pIter_00->aLvl[0].iRowid)) break;
          iVar4 = pIter_00->aLvl[0].iLeafPgno;
          fts5DlidxIterNextR(p,pIter_00,0);
        } while (p->rc == 0);
        if (iVar4 <= pIter_01->iLeafPgno) goto LAB_001cbb4b;
        if (pIter_01->pSeg->pgnoLast < iVar4) {
LAB_001cb9a4:
          p->rc = 0x10b;
        }
        else {
          sqlite3_free(pIter_01->pNextLeaf);
          pIter_01->pNextLeaf = (Fts5Data *)0x0;
          pIter_01->iLeafPgno = iVar4 + -1;
          fts5SegIterNextPage(p,pIter_01);
          if (p->rc == 0) {
            puVar2 = (ushort *)pIter_01->pLeaf->p;
            uVar5 = *puVar2;
            uVar5 = uVar5 << 8 | uVar5 >> 8;
            if ((uVar5 < 4) || (pIter_01->pLeaf->szLeaf <= (int)(uint)uVar5)) goto LAB_001cb9a4;
            bVar3 = sqlite3Fts5GetVarint
                              ((uchar *)((long)puVar2 + (ulong)uVar5),(u64 *)&pIter_01->iRowid);
            pIter_01->iLeafOffset = (uint)bVar3 + (uint)uVar5;
            fts5SegIterLoadNPos(p,pIter_01);
          }
        }
      }
      else {
        do {
          if ((pIter_00->aLvl[0].bEof != 0) || (pIter_00->aLvl[0].iRowid <= iFrom)) break;
          fts5DlidxIterPrevR(p,pIter_00,0);
        } while (p->rc == 0);
        iVar4 = pIter_00->aLvl[0].iLeafPgno;
        if (pIter_01->iLeafPgno <= iVar4) goto LAB_001cbb4b;
        pIter_01->iLeafPgno = iVar4 + 1;
        fts5SegIterReverseNewPage(p,pIter_01);
      }
      while (pIter_01->pLeaf != (Fts5Data *)0x0) {
        if ((local_3c & 2) == 0) {
          if (iFrom <= pIter_01->iRowid) break;
        }
        else if (pIter_01->iRowid <= iFrom) break;
        if (p->rc != 0) break;
LAB_001cbb4b:
        if (p->rc == 0) {
          (*pIter_01->xNext)(p,pIter_01,(int *)0x0);
        }
      }
    }
    if (((pIter_01->pLeaf == (Fts5Data *)0x0) || (local_4c != 0)) ||
       (iVar4 = fts5MultiIterAdvanceRowid(pIter,(uint)uVar1,&local_48), iVar4 != 0)) {
      fts5MultiIterAdvanced(p,pIter,(uint)uVar1,1);
      uVar1 = pIter->aFirst[1].iFirst;
      bVar6 = local_38[uVar1].pLeaf == (Fts5Data *)0x0;
      (pIter->base).bEof = bVar6;
      local_48 = local_38 + uVar1;
      pIter->iSwitchRowid = local_38[uVar1].iRowid;
      if (!bVar6) goto LAB_001cbb15;
LAB_001cbb33:
      bVar6 = false;
    }
    else {
LAB_001cbb15:
      if ((pIter->bSkipEmpty == '\0') || (local_48->nPos != 0)) {
        (*pIter->xSetOutputs)(pIter,local_48);
        goto LAB_001cbb33;
      }
      bVar6 = true;
      local_50 = 0;
    }
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

static void fts5MultiIterNext(
  Fts5Index *p, 
  Fts5Iter *pIter,
  int bFrom,                      /* True if argument iFrom is valid */
  i64 iFrom                       /* Advance at least as far as this */
){
  int bUseFrom = bFrom;
  assert( pIter->base.bEof==0 );
  while( p->rc==SQLITE_OK ){
    int iFirst = pIter->aFirst[1].iFirst;
    int bNewTerm = 0;
    Fts5SegIter *pSeg = &pIter->aSeg[iFirst];
    assert( p->rc==SQLITE_OK );
    if( bUseFrom && pSeg->pDlidx ){
      fts5SegIterNextFrom(p, pSeg, iFrom);
    }else{
      pSeg->xNext(p, pSeg, &bNewTerm);
    }

    if( pSeg->pLeaf==0 || bNewTerm 
     || fts5MultiIterAdvanceRowid(pIter, iFirst, &pSeg)
    ){
      fts5MultiIterAdvanced(p, pIter, iFirst, 1);
      fts5MultiIterSetEof(pIter);
      pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      if( pSeg->pLeaf==0 ) return;
    }

    fts5AssertMultiIterSetup(p, pIter);
    assert( pSeg==&pIter->aSeg[pIter->aFirst[1].iFirst] && pSeg->pLeaf );
    if( pIter->bSkipEmpty==0 || pSeg->nPos ){
      pIter->xSetOutputs(pIter, pSeg);
      return;
    }
    bUseFrom = 0;
  }
}